

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

Symbol * __thiscall
anon_unknown.dwarf_ca99e8::InstanceBuilder::create
          (InstanceBuilder *this,HierarchicalInstanceSyntax *syntax)

{
  ASTContext *this_00;
  Symbol *pSVar1;
  SourceRange sourceRange;
  Symbol *local_20;
  
  createImplicitNets(syntax,this->context,this->netType,
                     (bitmask<slang::ast::InstanceFlags>)
                     (underlying_type)*(undefined4 *)&this->flags,&this->implicitNetNames,
                     this->implicitNets);
  (this->path).super_SmallVectorBase<unsigned_int>.len = 0;
  if (syntax->decl == (InstanceNameSyntax *)0x0) {
    this_00 = this->context;
    sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
    slang::ast::ASTContext::addDiag(this_00,(DiagCode)0x4e0006,sourceRange);
    pSVar1 = createInstance(this,syntax,(HierarchyOverrideNode *)0x0);
    return pSVar1;
  }
  _GLOBAL__N_1::InstanceBuilder::create();
  return local_20;
}

Assistant:

Symbol* create(const HierarchicalInstanceSyntax& syntax) {
        createImplicitNets(syntax, context, netType, flags, implicitNetNames, implicitNets);

        path.clear();

        if (!syntax.decl) {
            context.addDiag(diag::InstanceNameRequired, syntax.sourceRange());
            return createInstance(syntax, nullptr);
        }

        const HierarchyOverrideNode* overrideNode = nullptr;
        if (parentOverrideNode) {
            if (auto sit = parentOverrideNode->childNodes.find(overrideSyntax ? *overrideSyntax
                                                                              : syntax);
                sit != parentOverrideNode->childNodes.end()) {
                overrideNode = &sit->second;
            }
        }

        auto dims = syntax.decl->dimensions;
        return recurse(syntax, overrideNode, dims.begin(), dims.end());
    }